

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

bool webrtc::ArePerpendicular(Point *a,Point *b)

{
  return ABS(a->c[2] * b->c[2] + a->c[0] * b->c[0] + a->c[1] * b->c[1]) < 1e-06;
}

Assistant:

T x() const { return c[0]; }